

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chests.c
# Opt level: O0

BOOL is_dungeon_tileset(dw_map_index map)

{
  BOOL local_c;
  dw_map_index map_local;
  
  local_c = (BOOL)(SOUTHERN_SHRINE < map);
  return local_c;
}

Assistant:

static BOOL is_dungeon_tileset(dw_map_index map)
{
    switch(map) {
        case NO_MAP:
        case OVERWORLD:
        case CHARLOCK:
        case HAUKSNESS:
        case TANTEGEL:
        case TANTEGEL_THRONE_ROOM:
        case CHARLOCK_THRONE_ROOM:
        case KOL:
        case BRECCONARY:
        case GARINHAM:
        case CANTLIN:
        case RIMULDAR:
        case TANTEGEL_BASEMENT:
        case NORTHERN_SHRINE:
        case SOUTHERN_SHRINE:
            return FALSE;
        case CHARLOCK_CAVE_1:
        case CHARLOCK_CAVE_2:
        case CHARLOCK_CAVE_3:
        case CHARLOCK_CAVE_4:
        case CHARLOCK_CAVE_5:
        case CHARLOCK_CAVE_6:
        case SWAMP_CAVE:
        case MOUNTAIN_CAVE:
        case MOUNTAIN_CAVE_2:
        case GARINS_GRAVE_1:
        case GARINS_GRAVE_2:
        case GARINS_GRAVE_3:
        case GARINS_GRAVE_4:
        case ERDRICKS_CAVE:
        case ERDRICKS_CAVE_2:
        default:
                return TRUE;
    }
}